

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TypeReferenceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TypeReferenceSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TypeReferenceSyntax *pTVar16;
  
  pTVar16 = (TypeReferenceSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TypeReferenceSyntax *)this->endPtr < pTVar16 + 1) {
    pTVar16 = (TypeReferenceSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pTVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pTVar16->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = TypeReference;
  (pTVar16->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0
  ;
  (pTVar16->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pTVar16->typeKeyword).kind = TVar4;
  (pTVar16->typeKeyword).field_0x2 = uVar5;
  (pTVar16->typeKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pTVar16->typeKeyword).rawLen = uVar7;
  (pTVar16->typeKeyword).info = pIVar1;
  (pTVar16->openParen).kind = TVar8;
  (pTVar16->openParen).field_0x2 = uVar9;
  (pTVar16->openParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (pTVar16->openParen).rawLen = uVar11;
  (pTVar16->openParen).info = pIVar2;
  (pTVar16->expr).ptr = args_2;
  (pTVar16->closeParen).kind = TVar12;
  (pTVar16->closeParen).field_0x2 = uVar13;
  (pTVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pTVar16->closeParen).rawLen = uVar15;
  (pTVar16->closeParen).info = pIVar3;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pTVar16;
  return pTVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }